

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O2

char * strip_spaces(char *name)

{
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  byte *pbVar4;
  
  while( true ) {
    if (*name == 0) {
      return (char *)0x0;
    }
    iVar2 = OPENSSL_isspace((uint)(byte)*name);
    if (iVar2 == 0) break;
    name = (char *)((byte *)name + 1);
  }
  if (*name == 0) {
    return (char *)0x0;
  }
  sVar3 = strlen(name);
  do {
    sVar1 = sVar3;
    sVar3 = sVar1 - 1;
    if (sVar3 == 0) goto LAB_0019c762;
    iVar2 = OPENSSL_isspace((uint)((byte *)name)[sVar3]);
  } while (iVar2 != 0);
  ((byte *)name)[sVar1] = 0;
LAB_0019c762:
  pbVar4 = (byte *)0x0;
  if (*name != 0) {
    pbVar4 = (byte *)name;
  }
  return (char *)pbVar4;
}

Assistant:

static char *strip_spaces(char *name) {
  char *p, *q;
  // Skip over leading spaces
  p = name;
  while (*p && OPENSSL_isspace((unsigned char)*p)) {
    p++;
  }
  if (!*p) {
    return NULL;
  }
  q = p + strlen(p) - 1;
  while ((q != p) && OPENSSL_isspace((unsigned char)*q)) {
    q--;
  }
  if (p != q) {
    q[1] = 0;
  }
  if (!*p) {
    return NULL;
  }
  return p;
}